

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_map_s_unittest.cpp
# Opt level: O0

void __thiscall
SortMapSUnitTest_basic_operations_Test::SortMapSUnitTest_basic_operations_Test
          (SortMapSUnitTest_basic_operations_Test *this)

{
  SortMapSUnitTest_basic_operations_Test *this_local;
  
  SortMapSUnitTest::SortMapSUnitTest(&this->super_SortMapSUnitTest);
  (this->super_SortMapSUnitTest).super_Test._vptr_Test =
       (_func_int **)&PTR__SortMapSUnitTest_basic_operations_Test_00194830;
  return;
}

Assistant:

TEST_F(SortMapSUnitTest, basic_operations)
{
    using MyMap = estl::sort_map_s<std::string, std::string, 30>;
    MyMap m;

    EXPECT_EQ(static_cast<size_t>(0u), m.size());

    m["key_100"] = "val_100";
    EXPECT_EQ(1u, m.size());
    EXPECT_EQ("val_100", m["key_100"]);

    m["key_090"] = "val_090";
    EXPECT_EQ(2u, m.size());
    EXPECT_EQ("val_090", m["key_090"]);

    m["key_080"] = "val_080";
    EXPECT_EQ(3u, m.size());
    EXPECT_EQ("val_080", m["key_080"]);

    m["key_180"] = "val_180";
    EXPECT_EQ(4u, m.size());
    EXPECT_EQ("val_180", m["key_180"]);

    auto it = m.find("key_090");
    EXPECT_EQ("val_090", it->second);
}